

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::SpecparamSymbol::serializeTo(SpecparamSymbol *this,ASTSerializer *serializer)

{
  ConstantValue *pCVar1;
  Symbol *pSVar2;
  SpecparamSymbol *in_RSI;
  long in_RDI;
  Symbol *in_stack_00000038;
  ASTSerializer *in_stack_00000040;
  string_view in_stack_00000048;
  Symbol *symbol_1;
  Symbol *symbol;
  SpecparamSymbol *in_stack_00000138;
  undefined1 in_stack_00000140 [16];
  SpecparamSymbol *in_stack_ffffffffffffff40;
  SpecparamSymbol *in_stack_ffffffffffffff48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  SpecparamSymbol *this_00;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  ASTSerializer::write
            ((ASTSerializer *)in_RSI,local_20,local_18,(ulong)(*(byte *)(in_RDI + 0x150) & 1));
  if ((*(byte *)(in_RDI + 0x150) & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff40);
    pCVar1 = getValue(in_stack_00000138,(SourceRange)in_stack_00000140);
    ASTSerializer::write((ASTSerializer *)in_RSI,local_80,local_78,(size_t)pCVar1);
  }
  else {
    this_00 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff48);
    pCVar1 = getPulseRejectLimit(this_00);
    ASTSerializer::write((ASTSerializer *)this_00,local_30,local_28,(size_t)pCVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff48);
    pCVar1 = getPulseErrorLimit(this_00);
    ASTSerializer::write((ASTSerializer *)in_RSI,local_40,local_38,(size_t)pCVar1);
    pSVar2 = getPathSource(in_stack_ffffffffffffff40);
    if (pSVar2 != (Symbol *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
      ASTSerializer::writeLink(in_stack_00000040,in_stack_00000048,in_stack_00000038);
      in_stack_ffffffffffffff48 = in_RSI;
    }
    pSVar2 = getPathDest(in_stack_ffffffffffffff40);
    if (pSVar2 != (Symbol *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
                 (char *)in_stack_ffffffffffffff48);
      ASTSerializer::writeLink(in_stack_00000040,in_stack_00000048,in_stack_00000038);
    }
  }
  return;
}

Assistant:

void SpecparamSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isPathPulse", isPathPulse);
    if (isPathPulse) {
        serializer.write("rejectLimit", getPulseRejectLimit());
        serializer.write("errorLimit", getPulseErrorLimit());
        if (auto symbol = getPathSource())
            serializer.writeLink("pathSource", *symbol);
        if (auto symbol = getPathDest())
            serializer.writeLink("pathDest", *symbol);
    }
    else {
        serializer.write("value", getValue());
    }
}